

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_blow(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  blow_method *pbVar5;
  blow_effect *pbVar6;
  random_conflict rVar7;
  undefined8 local_38;
  undefined8 local_30;
  long *local_28;
  monster_blow *b;
  monster_race *r;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  local_28 = *(long **)((long)pvVar2 + 0x78);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if (local_28 == (long *)0x0) {
      pvVar3 = mem_zalloc(0x30);
      *(void **)((long)pvVar2 + 0x78) = pvVar3;
      local_28 = *(long **)((long)pvVar2 + 0x78);
    }
    else {
      for (; *local_28 != 0; local_28 = (long *)*local_28) {
      }
      pvVar2 = mem_zalloc(0x30);
      *local_28 = (long)pvVar2;
      local_28 = (long *)*local_28;
    }
    pcVar4 = parser_getsym(p,"method");
    pbVar5 = findmeth(pcVar4);
    *(blow_method **)((long)local_28 + 8) = pbVar5;
    if (*(long *)((long)local_28 + 8) == 0) {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_BLOW;
    }
    else {
      _Var1 = parser_hasval(p,"effect");
      if (_Var1) {
        pcVar4 = parser_getsym(p,"effect");
        pbVar6 = findeff(pcVar4);
        *(blow_effect **)((long)local_28 + 0x10) = pbVar6;
        if (*(long *)((long)local_28 + 0x10) == 0) {
          return PARSE_ERROR_INVALID_EFFECT;
        }
      }
      else {
        pbVar6 = findeff("NONE");
        *(blow_effect **)((long)local_28 + 0x10) = pbVar6;
      }
      _Var1 = parser_hasval(p,"damage");
      if (_Var1) {
        rVar7 = parser_getrand(p,"damage");
        local_38 = rVar7._0_8_;
        *(undefined8 *)((long)local_28 + 0x18) = local_38;
        local_30 = rVar7._8_8_;
        *(undefined8 *)((long)local_28 + 0x20) = local_30;
      }
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_blow(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_blow *b = r->blow;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	/* Go to the last valid blow, then allocate a new one */
	if (!b) {
		r->blow = mem_zalloc(sizeof(struct monster_blow));
		b = r->blow;
	} else {
		while (b->next)
			b = b->next;
		b->next = mem_zalloc(sizeof(struct monster_blow));
		b = b->next;
	}

	/* Now read the data */
	b->method = findmeth(parser_getsym(p, "method"));
	if (!b->method)
		return PARSE_ERROR_UNRECOGNISED_BLOW;
	if (parser_hasval(p, "effect")) {
		b->effect = findeff(parser_getsym(p, "effect"));
		if (!b->effect)
			return PARSE_ERROR_INVALID_EFFECT;
	} else {
		b->effect = findeff("NONE");
	}
	if (parser_hasval(p, "damage"))
		b->dice = parser_getrand(p, "damage");

	return PARSE_ERROR_NONE;
}